

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O1

void __thiscall
Minisat::Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::percolateDown
          (Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this,int i)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  LMap<int> *pLVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  
  piVar3 = (this->heap).data;
  piVar4 = (this->indices).map.data;
  iVar1 = piVar3[i];
  pLVar5 = (this->lt).n_occ;
  while( true ) {
    iVar7 = i * 2 + 1;
    iVar2 = (this->heap).sz;
    if (iVar2 <= iVar7) break;
    iVar8 = i * 2 + 2;
    if ((iVar2 <= iVar8) ||
       (piVar6 = (pLVar5->super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>).map.data,
       (ulong)((long)piVar6[piVar3[iVar7] * 2 + 1] * (long)piVar6[(long)piVar3[iVar7] * 2]) <=
       (ulong)((long)piVar6[piVar3[iVar8] * 2 + 1] * (long)piVar6[(long)piVar3[iVar8] * 2]))) {
      iVar8 = iVar7;
    }
    iVar2 = piVar3[iVar8];
    piVar6 = (pLVar5->super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>).map.data;
    if ((ulong)((long)piVar6[iVar1 * 2 + 1] * (long)piVar6[(long)iVar1 * 2]) <=
        (ulong)((long)piVar6[iVar2 * 2 + 1] * (long)piVar6[(long)iVar2 * 2])) break;
    piVar3[i] = iVar2;
    piVar4[iVar2] = i;
    i = iVar8;
  }
  piVar3[i] = iVar1;
  (this->indices).map.data[iVar1] = i;
  return;
}

Assistant:

void percolateDown(int i)
    {
        K x = heap[i];
        while (left(i) < heap.size()){
            int child = right(i) < heap.size() && lt(heap[right(i)], heap[left(i)]) ? right(i) : left(i);
            if (!lt(heap[child], x)) break;
            heap[i]          = heap[child];
            indices[heap[i]] = i;
            i                = child;
        }
        heap   [i] = x;
        indices[x] = i;
    }